

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O0

int add_linux_if(pcap_if_t **devlistp,char *ifname,int fd,char *errbuf)

{
  char cVar1;
  int iVar2;
  bpf_u_int32 flags;
  ushort **ppuVar3;
  int *piVar4;
  char *pcVar5;
  bool bVar6;
  char local_270 [8];
  ifreq ifrflags;
  char *saveq;
  char *q;
  char name [512];
  char *p;
  char *errbuf_local;
  int fd_local;
  char *ifname_local;
  pcap_if_t **devlistp_local;
  
  saveq = (char *)&q;
  name._504_8_ = ifname;
  while( true ) {
    bVar6 = false;
    if ((*(char *)name._504_8_ != '\0') && (bVar6 = false, (*(byte *)name._504_8_ & 0x80) == 0)) {
      ppuVar3 = __ctype_b_loc();
      bVar6 = ((*ppuVar3)[(int)*(char *)name._504_8_] & 0x2000) == 0;
    }
    if (!bVar6) goto LAB_001274de;
    if (*(char *)name._504_8_ == ':') break;
    cVar1 = *(char *)name._504_8_;
    name._504_8_ = name._504_8_ + 1;
    *saveq = cVar1;
    saveq = saveq + 1;
  }
  ifrflags.ifr_ifru._16_8_ = saveq;
  while( true ) {
    bVar6 = false;
    if ((*(byte *)name._504_8_ & 0x80) == 0) {
      ppuVar3 = __ctype_b_loc();
      bVar6 = ((*ppuVar3)[(int)*(char *)name._504_8_] & 0x800) != 0;
    }
    if (!bVar6) break;
    cVar1 = *(char *)name._504_8_;
    name._504_8_ = name._504_8_ + 1;
    *saveq = cVar1;
    saveq = saveq + 1;
  }
  if (*(char *)name._504_8_ != ':') {
    saveq = (char *)ifrflags.ifr_ifru._16_8_;
  }
LAB_001274de:
  *saveq = '\0';
  strncpy(local_270,(char *)&q,0x10);
  ifrflags.ifr_ifrn.ifrn_name[7] = '\0';
  iVar2 = ioctl(fd,0x8913,local_270);
  if (iVar2 < 0) {
    piVar4 = __errno_location();
    if ((*piVar4 == 6) || (piVar4 = __errno_location(), *piVar4 == 0x13)) {
      devlistp_local._4_4_ = 0;
    }
    else {
      piVar4 = __errno_location();
      pcVar5 = pcap_strerror(*piVar4);
      snprintf(errbuf,0x100,"SIOCGIFFLAGS: %.*s: %s",0x10,local_270,pcVar5);
      devlistp_local._4_4_ = -1;
    }
  }
  else {
    flags = if_flags_to_pcap_flags((char *)&q,(int)(short)ifrflags.ifr_ifrn._8_2_);
    iVar2 = pcap_add_if(devlistp,(char *)&q,flags,(char *)0x0,errbuf);
    if (iVar2 == -1) {
      devlistp_local._4_4_ = -1;
    }
    else {
      devlistp_local._4_4_ = 0;
    }
  }
  return devlistp_local._4_4_;
}

Assistant:

static int
add_linux_if(pcap_if_t **devlistp, const char *ifname, int fd, char *errbuf)
{
	const char *p;
	char name[512];	/* XXX - pick a size */
	char *q, *saveq;
	struct ifreq ifrflags;

	/*
	 * Get the interface name.
	 */
	p = ifname;
	q = &name[0];
	while (*p != '\0' && isascii(*p) && !isspace(*p)) {
		if (*p == ':') {
			/*
			 * This could be the separator between a
			 * name and an alias number, or it could be
			 * the separator between a name with no
			 * alias number and the next field.
			 *
			 * If there's a colon after digits, it
			 * separates the name and the alias number,
			 * otherwise it separates the name and the
			 * next field.
			 */
			saveq = q;
			while (isascii(*p) && isdigit(*p))
				*q++ = *p++;
			if (*p != ':') {
				/*
				 * That was the next field,
				 * not the alias number.
				 */
				q = saveq;
			}
			break;
		} else
			*q++ = *p++;
	}
	*q = '\0';

	/*
	 * Get the flags for this interface.
	 */
	strlcpy(ifrflags.ifr_name, name, sizeof(ifrflags.ifr_name));
	if (ioctl(fd, SIOCGIFFLAGS, (char *)&ifrflags) < 0) {
		if (errno == ENXIO || errno == ENODEV)
			return (0);	/* device doesn't actually exist - ignore it */
		(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
		    "SIOCGIFFLAGS: %.*s: %s",
		    (int)sizeof(ifrflags.ifr_name),
		    ifrflags.ifr_name,
		    pcap_strerror(errno));
		return (-1);
	}

	/*
	 * Add an entry for this interface, with no addresses.
	 */
	if (pcap_add_if(devlistp, name,
	    if_flags_to_pcap_flags(name, ifrflags.ifr_flags), NULL,
	    errbuf) == -1) {
		/*
		 * Failure.
		 */
		return (-1);
	}

	return (0);
}